

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_set_zero(ggml_tensor *tensor)

{
  void *__s;
  _Bool _Var1;
  size_t __n;
  ggml_tensor *in_RDI;
  ggml_tensor *unaff_retaddr;
  ggml_tensor *offset;
  ggml_tensor *in_stack_fffffffffffffff8;
  
  _Var1 = ggml_is_empty(in_RDI);
  if (!_Var1) {
    if (in_RDI->buffer == (ggml_backend_buffer *)0x0) {
      if (in_RDI->data == (void *)0x0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                   0x17b5,"GGML_ASSERT(%s) failed","tensor->data");
      }
      __s = in_RDI->data;
      __n = ggml_nbytes(in_stack_fffffffffffffff8);
      memset(__s,0,__n);
    }
    else {
      offset = in_RDI;
      ggml_nbytes(in_stack_fffffffffffffff8);
      ggml_backend_tensor_memset
                (unaff_retaddr,(uint8_t)((ulong)in_stack_fffffffffffffff8 >> 0x38),(size_t)offset,
                 (size_t)in_RDI);
      in_RDI = offset;
    }
  }
  return in_RDI;
}

Assistant:

struct ggml_tensor * ggml_set_zero(struct ggml_tensor * tensor) {
    if (ggml_is_empty(tensor)) {
        return tensor;
    }
    if (tensor->buffer) {
        ggml_backend_tensor_memset(tensor, 0, 0, ggml_nbytes(tensor));
    } else {
        GGML_ASSERT(tensor->data);
        memset(tensor->data, 0, ggml_nbytes(tensor));
    }
    return tensor;
}